

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_truetype.h
# Opt level: O2

int stbtt_GetFontOffsetForIndex(uchar *font_collection,int index)

{
  uint uVar1;
  int iVar2;
  stbtt_uint32 sVar3;
  
  iVar2 = stbtt__isfont(font_collection);
  if (iVar2 == 0) {
    iVar2 = -1;
    if ((((*font_collection == 't') && (font_collection[1] == 't')) && (font_collection[2] == 'c'))
       && (font_collection[3] == 'f')) {
      sVar3 = ttULONG(font_collection + 4);
      if (((sVar3 == 0x20000) || (sVar3 == 0x10000)) &&
         (uVar1 = *(uint *)(font_collection + 8),
         index < (int)(uVar1 >> 0x18 | (uVar1 & 0xff0000) >> 8 | (uVar1 & 0xff00) << 8 |
                      uVar1 << 0x18))) {
        sVar3 = ttULONG(font_collection + (long)(index << 2) + 0xc);
        return sVar3;
      }
    }
  }
  else {
    iVar2 = -(uint)(index != 0);
  }
  return iVar2;
}

Assistant:

STBTT_DEF int stbtt_GetFontOffsetForIndex(const unsigned char *font_collection, int index)
{
   // if it's just a font, there's only one valid index
   if (stbtt__isfont(font_collection))
      return index == 0 ? 0 : -1;

   // check if it's a TTC
   if (stbtt_tag(font_collection, "ttcf")) {
      // version 1?
      if (ttULONG(font_collection+4) == 0x00010000 || ttULONG(font_collection+4) == 0x00020000) {
         stbtt_int32 n = ttLONG(font_collection+8);
         if (index >= n)
            return -1;
         return ttULONG(font_collection+12+index*4);
      }
   }
   return -1;
}